

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtestPlatform.cpp
# Opt level: O1

void GccPlatformSpecificRunTestInASeperateProcess
               (UtestShell *shell,TestPlugin *plugin,TestResult *result)

{
  TestResult *pTVar1;
  int iVar2;
  int __pid;
  int *piVar3;
  ulong uVar4;
  int status;
  SimpleString message;
  uint local_bc;
  TestResult *local_b8;
  UtestShell *local_b0;
  SimpleString local_a8;
  TestFailure local_98;
  
  local_bc = 0;
  local_b8 = result;
  iVar2 = (*PlatformSpecificFork)();
  pTVar1 = local_b8;
  if (iVar2 == -1) {
    SimpleString::SimpleString(&local_a8,"Call to fork() failed");
    TestFailure::TestFailure(&local_98,shell,&local_a8);
    (*local_b8->_vptr_TestResult[0xd])(local_b8,&local_98);
LAB_00117da6:
    TestFailure::~TestFailure(&local_98);
    SimpleString::~SimpleString(&local_a8);
  }
  else {
    local_b0 = shell;
    if (iVar2 == 0) {
      uVar4 = local_b8->failureCount_;
      (*shell->_vptr_UtestShell[0x25])(shell,plugin,local_b8);
      _exit((uint)(uVar4 < pTVar1->failureCount_));
    }
    uVar4 = 0;
    do {
      __pid = (*PlatformSpecificWaitPid)(iVar2,(int *)&local_bc,2);
      if (__pid == -1) {
        piVar3 = __errno_location();
        if (*piVar3 != 4) {
          SimpleString::SimpleString(&local_a8,"Call to waitpid() failed");
          TestFailure::TestFailure(&local_98,local_b0,&local_a8);
          (*local_b8->_vptr_TestResult[0xd])(local_b8,&local_98);
          goto LAB_00117da6;
        }
        if (0x1e < uVar4) {
          SimpleString::SimpleString
                    (&local_a8,
                     "Call to waitpid() failed with EINTR. Tried 30 times and giving up! Sometimes happens in debugger"
                    );
          TestFailure::TestFailure(&local_98,local_b0,&local_a8);
          (*local_b8->_vptr_TestResult[0xd])(local_b8,&local_98);
          goto LAB_00117da6;
        }
        uVar4 = uVar4 + 1;
      }
      else {
        if ((local_bc & 0xff00) == 0 || (local_bc & 0x7f) != 0) {
          if (0x1ffffff < (int)((local_bc & 0x7f) * 0x1000000 + 0x1000000)) {
            SimpleString::SimpleString(&local_a8,"Failed in separate process - killed by signal ");
            StringFrom((int)&local_98);
            SimpleString::operator+=(&local_a8,(SimpleString *)&local_98);
            SimpleString::~SimpleString((SimpleString *)&local_98);
            TestFailure::TestFailure(&local_98,local_b0,&local_a8);
            (*local_b8->_vptr_TestResult[0xd])(local_b8,&local_98);
            goto LAB_00117cec;
          }
          if ((char)local_bc == '\x7f') {
            SimpleString::SimpleString(&local_a8,"Stopped in separate process - continuing");
            TestFailure::TestFailure(&local_98,local_b0,&local_a8);
            (*local_b8->_vptr_TestResult[0xd])(local_b8,&local_98);
            goto LAB_00117cec;
          }
        }
        else {
          SimpleString::SimpleString(&local_a8,"Failed in separate process");
          TestFailure::TestFailure(&local_98,local_b0,&local_a8);
          (*local_b8->_vptr_TestResult[0xd])(local_b8,&local_98);
LAB_00117cec:
          TestFailure::~TestFailure(&local_98);
          SimpleString::~SimpleString(&local_a8);
        }
        if ((char)local_bc == '\x7f') {
          kill(__pid,0x12);
        }
      }
    } while ((__pid == -1) ||
            (((local_bc & 0x7f) != 0 &&
             ((int)((local_bc & 0x7f) * 0x1000000 + 0x1000000) < 0x2000000))));
  }
  return;
}

Assistant:

static void GccPlatformSpecificRunTestInASeperateProcess(UtestShell* shell, TestPlugin* plugin, TestResult* result)
{
    const pid_t syscallError = -1;
    pid_t cpid;
    pid_t w;
    int status = 0;

    cpid = PlatformSpecificFork();

    if (cpid == syscallError) {
        result->addFailure(TestFailure(shell, "Call to fork() failed"));
        return;
    }

    if (cpid == 0) {            /* Code executed by child */
        const size_t initialFailureCount = result->getFailureCount(); // LCOV_EXCL_LINE
        shell->runOneTestInCurrentProcess(plugin, *result);        // LCOV_EXCL_LINE
        _exit(initialFailureCount < result->getFailureCount());    // LCOV_EXCL_LINE
    } else {                    /* Code executed by parent */
        size_t amountOfRetries = 0;
        do {
            w = PlatformSpecificWaitPid(cpid, &status, WUNTRACED);
            if (w == syscallError) {
                // OS X debugger causes EINTR
                if (EINTR == errno) {
                  if (amountOfRetries > 30) {
                    result->addFailure(TestFailure(shell, "Call to waitpid() failed with EINTR. Tried 30 times and giving up! Sometimes happens in debugger"));
                    return;
                  }
                  amountOfRetries++;
                }
                else {
                    result->addFailure(TestFailure(shell, "Call to waitpid() failed"));
                    return;
                }
            } else {
                SetTestFailureByStatusCode(shell, result, status);
                if (WIFSTOPPED(status)) kill(w, SIGCONT);
            }
        } while ((w == syscallError) || (!WIFEXITED(status) && !WIFSIGNALED(status)));
    }
}